

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseHostRef(WastParser *this,Const *const_)

{
  anon_union_16_2_ecfd7102_for_Location_1 *paVar1;
  TokenType TVar2;
  Result RVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  uint64_t ref_bits;
  Token token;
  char *local_d8;
  size_type sStack_d0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_c8;
  undefined8 uStack_c0;
  Token local_b0;
  Token local_70;
  
  Consume(&local_70,this);
  if (this->options_[9] == (WastParseOptions)0x0) {
    Error(this,0x1ac086);
  }
  else {
    GetToken(&local_b0,this);
    local_c8.offset = (size_t)local_b0.loc.field_1.field_1.offset;
    uStack_c0 = local_b0.loc.field_1._8_8_;
    local_d8 = local_b0.loc.filename.data_;
    sStack_d0 = local_b0.loc.filename.size_;
    (const_->loc).field_1.field_1.offset = (size_t)local_b0.loc.field_1.field_1.offset;
    *(undefined8 *)((long)&(const_->loc).field_1 + 8) = local_b0.loc.field_1._8_8_;
    (const_->loc).filename.data_ = local_b0.loc.filename.data_;
    (const_->loc).filename.size_ = local_b0.loc.filename.size_;
    TVar2 = Peek(this,0);
    if ((TVar2 & ~Array) != Int) {
      paVar1 = &local_b0.loc.field_1;
      local_b0.loc.filename.data_ = (char *)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"a numeric literal","");
      local_d8 = (char *)0x0;
      sStack_d0 = 0;
      local_c8.offset = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
                 &local_b0,&local_b0.token_type_);
      RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_d8,"123");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_d8);
      if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_b0.loc.filename.data_ == paVar1) {
        return (Result)RVar3.enum_;
      }
      operator_delete(local_b0.loc.filename.data_);
      return (Result)RVar3.enum_;
    }
    Consume(&local_b0,this);
    if (2 < local_b0.token_type_ - First_Literal) {
      __assert_fail("HasLiteral()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/token.h"
                    ,0x6a,"const Literal &wabt::Token::literal() const");
    }
    RVar3 = ParseInt64(local_b0.field_2.literal_.text.data_,
                       local_b0.field_2.literal_.text.data_ + local_b0.field_2.literal_.text.size_,
                       (uint64_t *)&local_b0,UnsignedOnly);
    (const_->type_).enum_ = Hostref;
    *(char **)(const_->data_).v = local_b0.loc.filename.data_;
    const_->nan_[0] = None;
    if (RVar3.enum_ != Error) {
      return (Result)Ok;
    }
    Error(this,const_->loc,"invalid literal \"%.*s\"",
          local_b0.field_2.literal_.text.size_ & 0xffffffff,local_b0.field_2.text_.size_,in_R8,in_R9
         );
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseHostRef(Const* const_) {
  WABT_TRACE(ParseHostRef);
  Token token = Consume();
  if (!options_->features.reference_types_enabled()) {
    Error(token.loc, "hostref not allowed");
    return Result::Error;
  }

  Literal literal;
  string_view sv;
  const char* s;
  const char* end;
  const_->loc = GetLocation();
  TokenType token_type = Peek();

  switch (token_type) {
    case TokenType::Nat:
    case TokenType::Int: {
      literal = Consume().literal();
      sv = literal.text;
      s = sv.begin();
      end = sv.end();
      break;
    }
    default:
      return ErrorExpected({"a numeric literal"}, "123");
  }

  uint64_t ref_bits;
  Result result = ParseInt64(s, end, &ref_bits, ParseIntType::UnsignedOnly);

  const_->set_hostref(static_cast<uintptr_t>(ref_bits));

  if (Failed(result)) {
    Error(const_->loc, "invalid literal \"" PRIstringview "\"",
          WABT_PRINTF_STRING_VIEW_ARG(literal.text));
    // Return if parser get errors.
    return Result::Error;
  }

  return Result::Ok;
}